

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_getfenv(lua_State *L,int idx)

{
  uint32_t uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  long lVar4;
  uint32_t uStack_10;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = (pTVar3->field_2).it;
  pTVar2 = L->top;
  lVar4 = 8;
  if ((uVar1 != 0xfffffff3) && (uVar1 != 0xfffffff7)) {
    if (uVar1 != 0xfffffff9) {
      uStack_10 = 0xffffffff;
      goto LAB_0010f965;
    }
    lVar4 = 0x2c;
  }
  (pTVar2->field_2).field_0 =
       *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
        ((ulong)(pTVar3->u32).lo + lVar4);
  uStack_10 = 0xfffffff4;
LAB_0010f965:
  (pTVar2->field_2).it = uStack_10;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_getfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  if (tvisfunc(o)) {
    settabV(L, L->top, tabref(funcV(o)->c.env));
  } else if (tvisudata(o)) {
    settabV(L, L->top, tabref(udataV(o)->env));
  } else if (tvisthread(o)) {
    settabV(L, L->top, tabref(threadV(o)->env));
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}